

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O3

int get_extra_by_id(int argc,char **argv)

{
  FILE *__stream;
  zip_flags_t zVar1;
  ulonglong uVar2;
  ulonglong uVar3;
  ulonglong uVar4;
  zip_uint8_t *data;
  undefined8 uVar5;
  int iVar6;
  zip_uint16_t eflen;
  ushort local_32;
  
  uVar2 = strtoull(*argv,(char **)0x0,10);
  uVar3 = strtoull(argv[1],(char **)0x0,10);
  uVar4 = strtoull(argv[2],(char **)0x0,10);
  zVar1 = get_flags(argv[3]);
  data = (zip_uint8_t *)
         zip_file_extra_field_get_by_id
                   (za,uVar2,(uint)uVar3 & 0xffff,(uint)uVar4 & 0xffff,&local_32,zVar1);
  __stream = _stderr;
  if (data == (zip_uint8_t *)0x0) {
    uVar5 = zip_strerror(za);
    fprintf(__stream,
            "can\'t get extra field data for file at index %lu, extra field id %d, ef index %d, flags %u: %s\n"
            ,uVar2,(ulong)((uint)uVar3 & 0xffff),(ulong)((uint)uVar4 & 0xffff),(ulong)zVar1,uVar5);
    iVar6 = -1;
  }
  else {
    iVar6 = 0;
    printf("Extra field 0x%04x: len %d",uVar3 & 0xffff,(ulong)local_32);
    if (local_32 != 0) {
      printf(", data ");
      hexdump(data,local_32);
    }
    putchar(10);
  }
  return iVar6;
}

Assistant:

static int
get_extra_by_id(int argc, char *argv[]) {
    zip_flags_t geflags;
    zip_uint16_t eid, eidx, eflen;
    const zip_uint8_t *efdata;
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    eid = (zip_uint16_t)strtoull(argv[1], NULL, 10);
    eidx = (zip_uint16_t)strtoull(argv[2], NULL, 10);
    geflags = get_flags(argv[3]);
    if ((efdata = zip_file_extra_field_get_by_id(za, idx, eid, eidx, &eflen, geflags)) == NULL) {
	fprintf(stderr, "can't get extra field data for file at index %" PRIu64 ", extra field id %d, ef index %d, flags %u: %s\n", idx, eid, eidx, geflags, zip_strerror(za));
	return -1;
    }
    printf("Extra field 0x%04x: len %d", eid, eflen);
    if (eflen > 0) {
	printf(", data ");
	hexdump(efdata, eflen);
    }
    printf("\n");
    return 0;
}